

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

int64_t duckdb::Date::EpochNanoseconds(date_t date)

{
  bool bVar1;
  ConversionException *this;
  date_t date_00;
  int64_t result;
  int64_t local_68;
  string local_60;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)date.days,86400000000000,&local_68);
  if (bVar1) {
    return local_68;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Could not convert DATE (%s) to nanoseconds","");
  ToString_abi_cxx11_(&local_40,(Date *)(ulong)(uint)date.days,date_00);
  ConversionException::ConversionException<std::__cxx11::string>(this,&local_60,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Date::EpochNanoseconds(date_t date) {
	int64_t result;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::MICROS_PER_DAY * 1000,
	                                                               result)) {
		throw ConversionException("Could not convert DATE (%s) to nanoseconds", Date::ToString(date));
	}
	return result;
}